

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O1

void __thiscall
wasm::BinaryenIRWriter<wasm::BinaryenIRToBinaryWriter>::visitPossibleBlockContents
          (BinaryenIRWriter<wasm::BinaryenIRToBinaryWriter> *this,Expression *curr)

{
  uintptr_t uVar1;
  Expression *curr_00;
  bool bVar2;
  char *in_RCX;
  ulong uVar3;
  Name target;
  
  if (curr->_id == BlockId) {
    target.super_IString.str._M_str = in_RCX;
    target.super_IString.str._M_len = curr[1].type.id;
    bVar2 = BranchUtils::BranchSeeker::has((BranchSeeker *)curr,*(Expression **)(curr + 1),target);
    if (!bVar2) {
      uVar1 = curr[2].type.id;
      if (uVar1 != 0) {
        uVar3 = 0;
        do {
          if (curr[2].type.id <= uVar3) {
            __assert_fail("index < usedElements",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                          ,0xbc,
                          "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                         );
          }
          curr_00 = *(Expression **)(*(long *)(curr + 2) + uVar3 * 8);
          visit(this,curr_00);
        } while (((curr_00->type).id != 1) && (bVar2 = uVar1 - 1 != uVar3, uVar3 = uVar3 + 1, bVar2)
                );
      }
      return;
    }
  }
  visit(this,curr);
  return;
}

Assistant:

void BinaryenIRWriter<SubType>::visitPossibleBlockContents(Expression* curr) {
  auto* block = curr->dynCast<Block>();
  // Even if the block has a name, check if the name is necessary (if it has no
  // uses, it is equivalent to not having one). Scanning the children of the
  // block means that this takes quadratic time, but it will be N^2 for a fairly
  // small N since the number of nested non-block control flow structures tends
  // to be very reasonable.
  if (!block || BranchUtils::BranchSeeker::has(block, block->name)) {
    visit(curr);
    return;
  }
  for (auto* child : block->list) {
    visit(child);
    // Since this child was unreachable, either this child or one of its
    // descendants was a source of unreachability that was actually
    // emitted. Subsequent children won't be reachable, so skip them.
    if (child->type == Type::unreachable) {
      break;
    }
  }
}